

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlHelper.cpp
# Opt level: O2

VariableType KDReports::XmlHelper::stringToVariableType(QString *type)

{
  bool bVar1;
  VariableType VVar2;
  QLatin1String s2;
  QLatin1String s2_00;
  QLatin1String s2_01;
  QLatin1String s2_02;
  QLatin1String s2_03;
  QLatin1String s2_04;
  QLatin1String s2_05;
  QLatin1String s2_06;
  char local_50 [8];
  char *local_48;
  char *local_40;
  char *local_38;
  QArrayDataPointer<char> local_30;
  
  s2.m_data = "pagenumber";
  s2.m_size = 10;
  bVar1 = operator==(type,s2);
  VVar2 = PageNumber;
  if (!bVar1) {
    s2_00.m_data = "pagecount";
    s2_00.m_size = 9;
    bVar1 = operator==(type,s2_00);
    if (bVar1) {
      VVar2 = PageCount;
    }
    else {
      s2_01.m_data = "textdate";
      s2_01.m_size = 8;
      bVar1 = operator==(type,s2_01);
      if (bVar1) {
        VVar2 = TextDate;
      }
      else {
        s2_02.m_data = "isodate";
        s2_02.m_size = 7;
        bVar1 = operator==(type,s2_02);
        if (bVar1) {
          VVar2 = ISODate;
        }
        else {
          s2_03.m_data = "localedate";
          s2_03.m_size = 10;
          bVar1 = operator==(type,s2_03);
          if (bVar1) {
            VVar2 = LocaleDate;
          }
          else {
            s2_04.m_data = "texttime";
            s2_04.m_size = 8;
            bVar1 = operator==(type,s2_04);
            if (bVar1) {
              VVar2 = TextTime;
            }
            else {
              s2_05.m_data = "isotime";
              s2_05.m_size = 7;
              bVar1 = operator==(type,s2_05);
              if (bVar1) {
                VVar2 = ISOTime;
              }
              else {
                s2_06.m_data = "localetime";
                s2_06.m_size = 10;
                bVar1 = operator==(type,s2_06);
                if (bVar1) {
                  VVar2 = LocaleTime;
                }
                else {
                  local_50[0] = '\x02';
                  local_50[1] = '\0';
                  local_50[2] = '\0';
                  local_50[3] = '\0';
                  local_50[4] = '.';
                  local_50[5] = '\0';
                  local_50[6] = '\0';
                  local_50[7] = '\0';
                  local_48 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsXmlHelper.cpp"
                  ;
                  local_40 = 
                  "static KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &)"
                  ;
                  local_38 = "default";
                  QString::toLocal8Bit((QByteArray *)&local_30,type);
                  if (local_30.ptr == (char *)0x0) {
                    local_30.ptr = (char *)&QByteArray::_empty;
                  }
                  VVar2 = PageNumber;
                  QMessageLogger::warning(local_50,"Unexpected variable type: %s",local_30.ptr);
                  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar2;
}

Assistant:

KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &type)
{
    if (type == QLatin1String("pagenumber"))
        return KDReports::PageNumber;
    else if (type == QLatin1String("pagecount"))
        return KDReports::PageCount;
    else if (type == QLatin1String("textdate"))
        return KDReports::TextDate;
    else if (type == QLatin1String("isodate"))
        return KDReports::ISODate;
    else if (type == QLatin1String("localedate"))
        return KDReports::LocaleDate;
    else if (type == QLatin1String("texttime"))
        return KDReports::TextTime;
    else if (type == QLatin1String("isotime"))
        return KDReports::ISOTime;
    else if (type == QLatin1String("localetime"))
        return KDReports::LocaleTime;
    qWarning("Unexpected variable type: %s", qPrintable(type));
    return KDReports::PageNumber;
}